

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::injectBuffersForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  _func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
  *p_Var1;
  cl_mem p_Var2;
  cl_command_queue p_Var3;
  bool bVar4;
  byte bVar5;
  _Ios_Openmode _Var6;
  CLIntercept *this_00;
  iterator platform_00;
  iterator func_name;
  reference ppVar7;
  mapped_type *pmVar8;
  CLdispatchX *pCVar9;
  key_type p_Var10;
  char *pcVar11;
  mapped_type_conflict *pmVar12;
  cl_icd_dispatch *pcVar13;
  void *pvVar14;
  cl_command_queue in_RCX;
  ulong in_RSI;
  CLIntercept *in_RDI;
  float __x;
  float __x_00;
  float __x_01;
  double __x_02;
  undefined1 auVar15 [16];
  void *ptr;
  cl_int error_1;
  size_t size_2;
  cl_int error;
  size_t size_1;
  CLdispatchX *dispatchX;
  size_t size;
  size_t fileSize;
  ifstream is;
  char tmpStr [256];
  string fileName;
  uint number;
  cl_mem memobj;
  void *allocation;
  cl_uint arg_index;
  iterator i;
  CArgMemMap *kernelArgMemMap;
  string prefix;
  vector<char,_std::allocator<char>_> transferBuf;
  cl_platform_id platform;
  lock_guard<std::mutex> lock;
  map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
  *in_stack_fffffffffffff968;
  lock_guard<std::mutex> *in_stack_fffffffffffff970;
  cl_kernel in_stack_fffffffffffff978;
  CLIntercept *in_stack_fffffffffffff980;
  CLIntercept *in_stack_fffffffffffff988;
  cl_icd_dispatch *in_stack_fffffffffffff990;
  key_type *in_stack_fffffffffffff9a8;
  iterator in_stack_fffffffffffff9b0;
  CLIntercept *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  string *in_stack_fffffffffffff9c8;
  Services_Common *in_stack_fffffffffffff9d0;
  bool local_589;
  undefined1 local_53c [20];
  _Self local_528 [3];
  _Self local_510;
  _Self local_508;
  CLdispatchX *local_500;
  allocator local_4f1;
  string local_4f0 [32];
  key_type local_4d0;
  _Self local_4c8;
  _Self local_4c0;
  fpos local_4b8 [16];
  key_type local_4a8;
  string local_4a0 [32];
  string local_480 [32];
  char local_460 [520];
  string local_258 [32];
  char local_238 [264];
  string local_130 [32];
  cl_mem local_110;
  mapped_type local_104;
  _Self local_100;
  _Self local_f8;
  _Self local_f0;
  _Self local_e8;
  _Self local_e0;
  _Self local_d8;
  cl_mem local_d0;
  cl_mem local_c8;
  uint local_bc;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  vector<char,_std::allocator<char>_> local_58;
  cl_platform_id local_30;
  cl_command_queue local_20;
  ulong local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffff970,(mutex_type *)in_stack_fffffffffffff968);
  local_30 = getPlatform(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x210044);
  std::__cxx11::string::string(local_78);
  OS(in_RDI);
  pcVar11 = sc_DumpDirectoryName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar11,&local_99);
  ::OS::Services_Common::GetDumpDirectoryNameWithoutPid
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
             (string *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::operator+=(local_78,"/Inject/");
  this_00 = (CLIntercept *)
            std::
            map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
            ::operator[]((map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                          *)in_stack_fffffffffffff9b0._M_node,in_stack_fffffffffffff9a8);
  platform_00 = std::
                map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                ::begin(in_stack_fffffffffffff968);
  while( true ) {
    func_name = std::
                map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                ::end(in_stack_fffffffffffff968);
    bVar4 = std::operator!=((_Self *)&stack0xffffffffffffff50,(_Self *)&stack0xffffffffffffff48);
    if (!bVar4) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_> *)0x210190)
    ;
    local_bc = ppVar7->first;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_> *)0x2101a6)
    ;
    local_d0 = (cl_mem)ppVar7->second;
    local_c8 = local_d0;
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_> *)
               in_stack_fffffffffffff970);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
         ::find((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                 *)in_stack_fffffffffffff968,(key_type *)0x2101eb);
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
         ::end((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                *)in_stack_fffffffffffff968);
    bVar4 = std::operator!=(&local_d8,&local_e0);
    local_589 = true;
    if (!bVar4) {
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
           ::find((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff968,(key_type *)0x210266);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
           ::end((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                  *)in_stack_fffffffffffff968);
      bVar4 = std::operator!=(&local_e8,&local_f0);
      local_589 = true;
      if (!bVar4) {
        local_f8._M_node =
             (_Base_ptr)
             std::
             map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
             ::find((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff968,(key_type *)0x2102dd);
        local_100._M_node =
             (_Base_ptr)
             std::
             map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
             ::end((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff968);
        local_589 = std::operator!=(&local_f8,&local_100);
      }
    }
    if (local_589 != false) {
      local_110 = local_d0;
      pmVar8 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[]((map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                             *)in_stack_fffffffffffff9b0._M_node,in_stack_fffffffffffff9a8);
      local_104 = *pmVar8;
      std::__cxx11::string::string(local_130,local_78);
      snprintf(local_238,0x100,"%04u",local_10 & 0xffffffff);
      std::__cxx11::string::operator+=(local_130,"Enqueue_");
      std::__cxx11::string::operator+=(local_130,local_238);
      std::__cxx11::string::operator+=(local_130,"_Kernel_");
      getShortKernelName_abi_cxx11_
                (in_stack_fffffffffffff9b8,(cl_kernel)in_stack_fffffffffffff9b0._M_node);
      std::__cxx11::string::operator+=(local_130,local_258);
      std::__cxx11::string::~string(local_258);
      snprintf(local_238,0x100,"%u",(ulong)local_bc);
      std::__cxx11::string::operator+=(local_130,"_Arg_");
      std::__cxx11::string::operator+=(local_130,local_238);
      snprintf(local_238,0x100,"%04u",(ulong)local_104);
      std::__cxx11::string::operator+=(local_130,"_Buffer_");
      std::__cxx11::string::operator+=(local_130,local_238);
      std::__cxx11::string::operator+=(local_130,".bin");
      std::ifstream::ifstream(local_460);
      _Var6 = std::__cxx11::string::c_str();
      std::operator|(_S_in,_S_bin);
      std::ifstream::open(local_460,_Var6);
      bVar5 = std::ios::good();
      if ((bVar5 & 1) != 0) {
        std::operator+((char *)in_stack_fffffffffffff9b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9b0._M_node);
        __x_02 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff978,
                                        (char *)in_stack_fffffffffffff970);
        log(in_RDI,__x_02);
        std::__cxx11::string::~string(local_480);
        std::__cxx11::string::~string(local_4a0);
        local_4a8 = (key_type)0x0;
        std::istream::seekg((long)local_460,_S_beg);
        auVar15 = std::istream::tellg();
        local_4b8 = (fpos  [16])auVar15;
        local_4a8 = (key_type)std::fpos::operator_cast_to_long(local_4b8);
        std::istream::seekg((long)local_460,_S_beg);
        local_4c0._M_node =
             (_Base_ptr)
             std::
             map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
             ::find((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff968,(key_type *)0x2106ab);
        local_4c8._M_node =
             (_Base_ptr)
             std::
             map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
             ::end((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff968);
        bVar4 = std::operator!=(&local_4c0,&local_4c8);
        if (bVar4) {
          pmVar12 = std::
                    map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                    ::operator[]((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                                  *)in_stack_fffffffffffff9b0._M_node,in_stack_fffffffffffff9a8);
          local_4d0 = (key_type)*pmVar12;
          if (local_4d0 < local_4a8) {
            logf(in_RDI,__x);
          }
          else {
            pCVar9 = CLIntercept::dispatchX
                               (in_stack_fffffffffffff988,(cl_platform_id)in_stack_fffffffffffff980)
            ;
            if (pCVar9->clEnqueueMemcpyINTEL ==
                (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_4f0,"clEnqueueMemcpyINTEL",&local_4f1);
              getExtensionFunctionAddress
                        (this_00,(cl_platform_id)platform_00._M_node,(string *)func_name._M_node);
              std::__cxx11::string::~string(local_4f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
            }
            p_Var10 = (key_type)std::vector<char,_std::allocator<char>_>::size(&local_58);
            if (p_Var10 < local_4d0) {
              std::vector<char,_std::allocator<char>_>::resize
                        ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
                         (size_type)in_stack_fffffffffffff988);
            }
            local_500 = CLIntercept::dispatchX
                                  (in_stack_fffffffffffff988,
                                   (cl_platform_id)in_stack_fffffffffffff980);
            if (local_500->clEnqueueMemcpyINTEL !=
                (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) {
              p_Var10 = (key_type)std::vector<char,_std::allocator<char>_>::size(&local_58);
              if (local_4d0 <= p_Var10) {
                pcVar11 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)0x210a30);
                std::istream::read(local_460,(long)pcVar11);
                p_Var3 = local_20;
                p_Var2 = local_c8;
                p_Var1 = local_500->clEnqueueMemcpyINTEL;
                pcVar11 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)0x210a8b);
                in_stack_fffffffffffff970 = (lock_guard<std::mutex> *)0x0;
                in_stack_fffffffffffff968 =
                     (map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                      *)0x0;
                (*p_Var1)(p_Var3,1,p_Var2,pcVar11,(size_t)local_4d0,0,(cl_event *)0x0,
                          (cl_event *)0x0);
              }
            }
          }
        }
        else {
          local_508._M_node =
               (_Base_ptr)
               std::
               map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
               ::find((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff968,(key_type *)0x210aee);
          local_510._M_node =
               (_Base_ptr)
               std::
               map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
               ::end((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                      *)in_stack_fffffffffffff968);
          bVar4 = std::operator!=(&local_508,&local_510);
          if (bVar4) {
            pmVar12 = std::
                      map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                      ::operator[]((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                                    *)in_stack_fffffffffffff9b0._M_node,in_stack_fffffffffffff9a8);
            local_528[2]._M_node = (_Base_ptr)*pmVar12;
            if (local_528[2]._M_node < local_4a8) {
              logf(in_RDI,__x_00);
            }
            else {
              pcVar13 = dispatch(in_RDI);
              in_stack_fffffffffffff970 = (lock_guard<std::mutex> *)0x0;
              in_stack_fffffffffffff968 =
                   (map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                    *)0x0;
              local_528[1]._M_node._4_4_ =
                   (*pcVar13->clEnqueueSVMMap)
                             (local_20,1,4,local_c8,(size_t)local_528[2]._M_node,0,(cl_event *)0x0,
                              (cl_event *)0x0);
              if (local_528[1]._M_node._4_4_ == 0) {
                std::istream::read(local_460,(long)local_c8);
                in_stack_fffffffffffff9b8 = (CLIntercept *)dispatch(in_RDI);
                (*(in_stack_fffffffffffff9b8->m_Dispatch).clGetPipeInfo)
                          (local_20,local_c8,0,(cl_event *)0x0,(cl_event *)0x0);
              }
            }
          }
          else {
            in_stack_fffffffffffff9b0 =
                 std::
                 map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                 ::find((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                         *)in_stack_fffffffffffff968,(key_type *)0x210ca2);
            local_528[0]._M_node = in_stack_fffffffffffff9b0._M_node;
            local_53c._12_8_ =
                 std::
                 map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                 ::end((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                        *)in_stack_fffffffffffff968);
            bVar4 = std::operator!=(local_528,(_Self *)(local_53c + 0xc));
            if (bVar4) {
              in_stack_fffffffffffff9a8 =
                   (key_type *)
                   std::
                   map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                   ::operator[]((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                                 *)in_stack_fffffffffffff9b0._M_node,
                                (key_type *)in_stack_fffffffffffff9a8);
              local_53c._4_8_ = *in_stack_fffffffffffff9a8;
              if ((ulong)local_53c._4_8_ < local_4a8) {
                logf(in_RDI,__x_01);
              }
              else {
                local_53c._0_4_ = 0;
                pcVar13 = dispatch(in_RDI);
                in_stack_fffffffffffff980 = (CLIntercept *)local_53c;
                in_stack_fffffffffffff978 = (cl_kernel)0x0;
                in_stack_fffffffffffff970 = (lock_guard<std::mutex> *)0x0;
                in_stack_fffffffffffff968 =
                     (map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                      *)((ulong)in_stack_fffffffffffff968 & 0xffffffff00000000);
                pvVar14 = (*pcVar13->clEnqueueMapBuffer)
                                    (local_20,local_d0,1,4,0,local_53c._4_8_,0,(cl_event *)0x0,
                                     (cl_event *)0x0,(cl_int *)in_stack_fffffffffffff980);
                if (local_53c._0_4_ == 0) {
                  std::istream::read(local_460,(long)pvVar14);
                  in_stack_fffffffffffff990 = dispatch(in_RDI);
                  (*in_stack_fffffffffffff990->clEnqueueUnmapMemObject)
                            (local_20,local_d0,pvVar14,0,(cl_event *)0x0,(cl_event *)0x0);
                }
              }
            }
          }
        }
      }
      std::ifstream::~ifstream(local_460);
      std::__cxx11::string::~string(local_130);
    }
  }
  std::__cxx11::string::~string(local_78);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff980);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x210ecc);
  return;
}

Assistant:

void CLIntercept::injectBuffersForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(kernel);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        void*   allocation = (void*)(*i).second;
        cl_mem  memobj = (cl_mem)allocation;

        ++i;

        if( ( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() ) ||
            ( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() ) ||
            ( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() ) )
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the buffer number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Buffer_";
                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".bin";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting buffer file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                if( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() )
                {
                    size_t size = m_USMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: USM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        if( dispatchX(platform).clEnqueueMemcpyINTEL == NULL )
                        {
                            getExtensionFunctionAddress(
                                platform,
                                "clEnqueueMemcpyINTEL" );
                        }
                        if( transferBuf.size() < size )
                        {
                            transferBuf.resize(size);
                        }

                        const auto& dispatchX = this->dispatchX(platform);
                        if( dispatchX.clEnqueueMemcpyINTEL &&
                            transferBuf.size() >= size )
                        {
                            is.read( transferBuf.data(), size );

                            dispatchX.clEnqueueMemcpyINTEL(
                                command_queue,
                                CL_TRUE,
                                allocation,
                                transferBuf.data(),
                                size,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() )
                {
                    size_t size = m_SVMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: SVM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = dispatch().clEnqueueSVMMap(
                            command_queue,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            allocation,
                            size,
                            0,
                            NULL,
                            NULL );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)allocation, size );

                            dispatch().clEnqueueSVMUnmap(
                                command_queue,
                                allocation,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
                {
                    size_t size = m_BufferInfoMap[ memobj ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: buffer size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = CL_SUCCESS;
                        void*   ptr = dispatch().clEnqueueMapBuffer(
                            command_queue,
                            memobj,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            0,
                            size,
                            0,
                            NULL,
                            NULL,
                            &error );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)ptr, size );

                            dispatch().clEnqueueUnmapMemObject(
                                command_queue,
                                memobj,
                                ptr,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
            }
        }
    }
}